

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::Loop8Test6Param_hbd_DISABLED_Speed_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::Loop8Test6Param_hbd_DISABLED_Speed_Test>
           *this)

{
  Test *this_00;
  
  WithParamInterface<std::tuple<void(*)(unsigned_short*,int,unsigned_char_const*,unsigned_char_const*,unsigned_char_const*,int),void(*)(unsigned_short*,int,unsigned_char_const*,unsigned_char_const*,unsigned_char_const*,int),int>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x30);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_01041800;
  this_00[1]._vptr_Test = (_func_int **)&PTR__Loop8Test6Param_hbd_DISABLED_Speed_Test_01041840;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }